

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateJsonNameConflictProto3Legacy_Test
::~ValidationErrorTest_ValidateJsonNameConflictProto3Legacy_Test
          (ValidationErrorTest_ValidateJsonNameConflictProto3Legacy_Test *this)

{
  ValidationErrorTest_ValidateJsonNameConflictProto3Legacy_Test *this_local;
  
  ~ValidationErrorTest_ValidateJsonNameConflictProto3Legacy_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateJsonNameConflictProto3Legacy) {
  BuildFile(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type {"
      "  name: 'Foo'"
      "  options { deprecated_legacy_json_field_conflicts: true }"
      "  field { name:'AB' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "  field { name:'_a__b_' number:2 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "}");
}